

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O3

void __thiscall
Diligent::QueryBase<Diligent::EngineVkImplTraits>::QueryBase
          (QueryBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,QueryDesc *Desc,bool bIsDeviceInternal)

{
  RenderDeviceVkImpl *pRVar1;
  int Line;
  char *Args;
  string msg;
  string local_30;
  
  DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>).
  super_ObjectBase<Diligent::IQueryVk>.super_RefCountedObject<Diligent::IQueryVk>.super_IQueryVk.
  super_IQuery.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00af1900;
  (this->m_pContext).m_pObject = (DeviceContextVkImpl *)0x0;
  this->m_State = Inactive;
  pRVar1 = DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>::
           GetDevice(&this->
                      super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                    );
  switch(Desc->Type) {
  case QUERY_TYPE_OCCLUSION:
    if ((pRVar1->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
        OcclusionQueries != DEVICE_FEATURE_STATE_DISABLED) {
      return;
    }
    Args = "Occlusion queries are not supported by this device";
    Line = 0x53;
    goto LAB_002c7023;
  case QUERY_TYPE_BINARY_OCCLUSION:
    if ((pRVar1->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
        BinaryOcclusionQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[58]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x58,(char (*) [58])"Binary occlusion queries are not supported by this device");
    }
    break;
  case QUERY_TYPE_TIMESTAMP:
    if ((pRVar1->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
        TimestampQueries != DEVICE_FEATURE_STATE_DISABLED) {
      return;
    }
    Args = "Timestamp queries are not supported by this device";
    Line = 0x5d;
LAB_002c7023:
    LogError<true,char[51]>
              (false,"QueryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,Line,(char (*) [51])Args);
    break;
  case QUERY_TYPE_PIPELINE_STATISTICS:
    if ((pRVar1->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
        PipelineStatisticsQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[61]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x62,(char (*) [61])"Pipeline statistics queries are not supported by this device"
                );
    }
    break;
  case QUERY_TYPE_DURATION:
    if ((pRVar1->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.DurationQueries
        == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[50]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x67,(char (*) [50])"Duration queries are not supported by this device");
    }
    break;
  default:
    FormatString<char[22]>(&local_30,(char (*) [22])"Unexpected query type");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"QueryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0x6b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

QueryBase(IReferenceCounters*   pRefCounters,
              RenderDeviceImplType* pDevice,
              const QueryDesc&      Desc,
              bool                  bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        const DeviceFeatures& Features = this->GetDevice()->GetFeatures();
        static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below");
        switch (Desc.Type)
        {
            case QUERY_TYPE_OCCLUSION:
                if (!Features.OcclusionQueries)
                    LOG_ERROR_AND_THROW("Occlusion queries are not supported by this device");
                break;

            case QUERY_TYPE_BINARY_OCCLUSION:
                if (!Features.BinaryOcclusionQueries)
                    LOG_ERROR_AND_THROW("Binary occlusion queries are not supported by this device");
                break;

            case QUERY_TYPE_TIMESTAMP:
                if (!Features.TimestampQueries)
                    LOG_ERROR_AND_THROW("Timestamp queries are not supported by this device");
                break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
                if (!Features.PipelineStatisticsQueries)
                    LOG_ERROR_AND_THROW("Pipeline statistics queries are not supported by this device");
                break;

            case QUERY_TYPE_DURATION:
                if (!Features.DurationQueries)
                    LOG_ERROR_AND_THROW("Duration queries are not supported by this device");
                break;

            default:
                UNEXPECTED("Unexpected query type");
        }
    }